

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O1

size_t __thiscall
proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator::ByteSizeLong
          (TestParsingMergeLite_RepeatedFieldsGenerator *this)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  Rep *pRVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite> *pRVar9;
  anon_union_176_1_493b367e_for_TestParsingMergeLite_RepeatedFieldsGenerator_3 *paVar10;
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1> *pRVar11;
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2> *pRVar12;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite> *pRVar13;
  anon_union_176_1_493b367e_for_TestParsingMergeLite_RepeatedFieldsGenerator_3 *this_00;
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1> *this_01;
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2> *this_02;
  
  lVar8 = (long)*(int *)((long)&this->field_0 + 8);
  this_00 = &this->field_0;
  paVar10 = this_00;
  if ((undefined1  [176])((undefined1  [176])this->field_0 & (undefined1  [176])0x1) !=
      (undefined1  [176])0x0) {
    pRVar5 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       ((RepeatedPtrFieldBase *)&this_00->_impl_);
    paVar10 = (anon_union_176_1_493b367e_for_TestParsingMergeLite_RepeatedFieldsGenerator_3 *)
              pRVar5->elements;
  }
  if ((undefined1  [176])((undefined1  [176])*this_00 & (undefined1  [176])0x1) !=
      (undefined1  [176])0x0) {
    pRVar5 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       ((RepeatedPtrFieldBase *)&this_00->_impl_);
    this_00 = (anon_union_176_1_493b367e_for_TestParsingMergeLite_RepeatedFieldsGenerator_3 *)
              pRVar5->elements;
  }
  iVar1 = *(int *)((long)&this->field_0 + 8);
  for (; paVar10 !=
         (anon_union_176_1_493b367e_for_TestParsingMergeLite_RepeatedFieldsGenerator_3 *)
         ((long)this_00 + (long)iVar1 * 8);
      paVar10 = (anon_union_176_1_493b367e_for_TestParsingMergeLite_RepeatedFieldsGenerator_3 *)
                ((long)paVar10 + 8)) {
    sVar6 = TestAllTypesLite::ByteSizeLong
                      ((TestAllTypesLite *)
                       (paVar10->_impl_).field1_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_);
    uVar4 = (uint)sVar6 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    lVar8 = lVar8 + sVar6 + (ulong)(iVar3 * 9 + 0x49U >> 6);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x20);
  pRVar9 = &(this->field_0)._impl_.field2_;
  pRVar13 = pRVar9;
  if ((*(byte *)((long)&this->field_0 + 0x18) & 1) != 0) {
    pRVar5 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&pRVar9->super_RepeatedPtrFieldBase);
    pRVar13 = (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)pRVar5->elements;
  }
  if (((ulong)(pRVar9->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar5 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&pRVar9->super_RepeatedPtrFieldBase);
    pRVar9 = (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)pRVar5->elements;
  }
  lVar8 = lVar8 + iVar1;
  iVar1 = *(int *)((long)&this->field_0 + 0x20);
  for (; pRVar13 !=
         (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)
         (&(pRVar9->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar13 = (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)
                &(pRVar13->super_RepeatedPtrFieldBase).current_size_) {
    sVar6 = TestAllTypesLite::ByteSizeLong
                      ((TestAllTypesLite *)(pRVar13->super_RepeatedPtrFieldBase).tagged_rep_or_elem_
                      );
    uVar4 = (uint)sVar6 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    lVar8 = lVar8 + sVar6 + (ulong)(iVar3 * 9 + 0x49U >> 6);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x38);
  pRVar9 = &(this->field_0)._impl_.field3_;
  pRVar13 = pRVar9;
  if ((*(byte *)((long)&this->field_0 + 0x30) & 1) != 0) {
    pRVar5 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&pRVar9->super_RepeatedPtrFieldBase);
    pRVar13 = (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)pRVar5->elements;
  }
  if (((ulong)(pRVar9->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar5 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&pRVar9->super_RepeatedPtrFieldBase);
    pRVar9 = (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)pRVar5->elements;
  }
  lVar8 = lVar8 + iVar1;
  iVar1 = *(int *)((long)&this->field_0 + 0x38);
  for (; pRVar13 !=
         (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)
         (&(pRVar9->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar13 = (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)
                &(pRVar13->super_RepeatedPtrFieldBase).current_size_) {
    sVar6 = TestAllTypesLite::ByteSizeLong
                      ((TestAllTypesLite *)(pRVar13->super_RepeatedPtrFieldBase).tagged_rep_or_elem_
                      );
    uVar4 = (uint)sVar6 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    lVar8 = lVar8 + sVar6 + (ulong)(iVar3 * 9 + 0x49U >> 6);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x50);
  this_01 = &(this->field_0)._impl_.group1_;
  pRVar11 = this_01;
  if ((*(byte *)((long)&this->field_0 + 0x48) & 1) != 0) {
    pRVar5 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&this_01->super_RepeatedPtrFieldBase);
    pRVar11 = (RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1>
               *)pRVar5->elements;
  }
  if (((ulong)(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar5 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&this_01->super_RepeatedPtrFieldBase);
    this_01 = (RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1>
               *)pRVar5->elements;
  }
  lVar8 = lVar8 + (long)iVar1 * 2;
  iVar1 = *(int *)((long)&this->field_0 + 0x50);
  for (; pRVar11 !=
         (RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1> *)
         (&(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar11 = (RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1>
                 *)&(pRVar11->super_RepeatedPtrFieldBase).current_size_) {
    sVar6 = TestParsingMergeLite_RepeatedFieldsGenerator_Group1::ByteSizeLong
                      ((TestParsingMergeLite_RepeatedFieldsGenerator_Group1 *)
                       (pRVar11->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    lVar8 = lVar8 + sVar6;
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x68);
  this_02 = &(this->field_0)._impl_.group2_;
  pRVar12 = this_02;
  if ((*(byte *)((long)&this->field_0 + 0x60) & 1) != 0) {
    pRVar5 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&this_02->super_RepeatedPtrFieldBase);
    pRVar12 = (RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2>
               *)pRVar5->elements;
  }
  if (((ulong)(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar5 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&this_02->super_RepeatedPtrFieldBase);
    this_02 = (RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2>
               *)pRVar5->elements;
  }
  lVar8 = lVar8 + (long)iVar1 * 4;
  iVar1 = *(int *)((long)&this->field_0 + 0x68);
  for (; pRVar12 !=
         (RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2> *)
         (&(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar12 = (RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2>
                 *)&(pRVar12->super_RepeatedPtrFieldBase).current_size_) {
    sVar6 = TestParsingMergeLite_RepeatedFieldsGenerator_Group2::ByteSizeLong
                      ((TestParsingMergeLite_RepeatedFieldsGenerator_Group2 *)
                       (pRVar12->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    lVar8 = lVar8 + sVar6;
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x80);
  pRVar9 = &(this->field_0)._impl_.ext1_;
  pRVar13 = pRVar9;
  if ((*(byte *)((long)&this->field_0 + 0x78) & 1) != 0) {
    pRVar5 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&pRVar9->super_RepeatedPtrFieldBase);
    pRVar13 = (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)pRVar5->elements;
  }
  if (((ulong)(pRVar9->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar5 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&pRVar9->super_RepeatedPtrFieldBase);
    pRVar9 = (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)pRVar5->elements;
  }
  lVar8 = lVar8 + (long)iVar1 * 2;
  iVar1 = *(int *)((long)&this->field_0 + 0x80);
  for (; pRVar13 !=
         (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)
         (&(pRVar9->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar13 = (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)
                &(pRVar13->super_RepeatedPtrFieldBase).current_size_) {
    sVar6 = TestAllTypesLite::ByteSizeLong
                      ((TestAllTypesLite *)(pRVar13->super_RepeatedPtrFieldBase).tagged_rep_or_elem_
                      );
    uVar4 = (uint)sVar6 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    lVar8 = lVar8 + sVar6 + (ulong)(iVar3 * 9 + 0x49U >> 6);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x98);
  pRVar9 = &(this->field_0)._impl_.ext2_;
  pRVar13 = pRVar9;
  if ((*(byte *)((long)&this->field_0 + 0x90) & 1) != 0) {
    pRVar5 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&pRVar9->super_RepeatedPtrFieldBase);
    pRVar13 = (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)pRVar5->elements;
  }
  if (((ulong)(pRVar9->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar5 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&pRVar9->super_RepeatedPtrFieldBase);
    pRVar9 = (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)pRVar5->elements;
  }
  sVar6 = (long)iVar1 * 2 + lVar8;
  iVar1 = *(int *)((long)&this->field_0 + 0x98);
  for (; pRVar13 !=
         (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)
         (&(pRVar9->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar13 = (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)
                &(pRVar13->super_RepeatedPtrFieldBase).current_size_) {
    sVar7 = TestAllTypesLite::ByteSizeLong
                      ((TestAllTypesLite *)(pRVar13->super_RepeatedPtrFieldBase).tagged_rep_or_elem_
                      );
    uVar4 = (uint)sVar7 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar6 = sVar6 + sVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6);
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    sVar6 = sVar6 + *(long *)((uVar2 & 0xfffffffffffffffe) + 0x10);
  }
  if (((int)sVar6 != 0) || ((this->field_0)._impl_._cached_size_.atom_ != 0)) {
    (this->field_0)._impl_._cached_size_.atom_ = (int)sVar6;
  }
  return sVar6;
}

Assistant:

::size_t TestParsingMergeLite_RepeatedFieldsGenerator::ByteSizeLong() const {
  const TestParsingMergeLite_RepeatedFieldsGenerator& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto2_unittest.TestAllTypesLite field1 = 1;
    {
      total_size += 1UL * this_._internal_field1_size();
      for (const auto& msg : this_._internal_field1()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_unittest.TestAllTypesLite field2 = 2;
    {
      total_size += 1UL * this_._internal_field2_size();
      for (const auto& msg : this_._internal_field2()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_unittest.TestAllTypesLite field3 = 3;
    {
      total_size += 1UL * this_._internal_field3_size();
      for (const auto& msg : this_._internal_field3()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator.Group1 group1 = 10 [features = {
    {
      total_size += 2UL * this_._internal_group1_size();
      for (const auto& msg : this_._internal_group1()) {
        total_size += ::google::protobuf::internal::WireFormatLite::GroupSize(msg);
      }
    }
    // repeated .proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator.Group2 group2 = 20 [features = {
    {
      total_size += 4UL * this_._internal_group2_size();
      for (const auto& msg : this_._internal_group2()) {
        total_size += ::google::protobuf::internal::WireFormatLite::GroupSize(msg);
      }
    }
    // repeated .proto2_unittest.TestAllTypesLite ext1 = 1000;
    {
      total_size += 2UL * this_._internal_ext1_size();
      for (const auto& msg : this_._internal_ext1()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_unittest.TestAllTypesLite ext2 = 1001;
    {
      total_size += 2UL * this_._internal_ext2_size();
      for (const auto& msg : this_._internal_ext2()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}